

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkatom.c
# Opt level: O0

LispPTR make_atom(char *char_base,DLword offset,DLword length)

{
  ushort uVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  ushort local_3a;
  unsigned_short first_char;
  char *pname_base;
  PNCell *pnptr;
  DLword reprobe;
  DLword atom_index;
  LispPTR hash_entry;
  DLword hash;
  DLword length_local;
  DLword offset_local;
  char *char_base_local;
  
  local_3a = (ushort)(byte)char_base[offset];
  if (length == 0) {
    atom_index = 0;
    local_3a = 0xff;
  }
  else {
    if (length == 1) {
      if (0x39 < local_3a) {
        return local_3a - 8;
      }
      if (0x2f < local_3a) {
        return local_3a + 0xdffd0;
      }
      return local_3a + 2;
    }
    atom_index = compute_hash(char_base,offset,length);
  }
  local_3a = local_3a ^ atom_index;
  while( true ) {
    if (*(short *)((ulong)(AtomHT + (int)(uint)atom_index) ^ 2) == 0) {
      return 0xffffffff;
    }
    uVar1 = *(short *)((ulong)(AtomHT + (int)(uint)atom_index) ^ 2) - 1;
    pDVar3 = NativeAligned2FromLAddr
                       (*(uint *)(AtomSpace + (long)(int)((uint)uVar1 * 5) * 2) & 0xfffffff);
    if ((length == *(byte *)((ulong)pDVar3 ^ 3)) &&
       (LVar2 = compare_chars((char *)((long)pDVar3 + 1),char_base + (int)(uint)offset,length),
       LVar2 == 1)) break;
    atom_index = atom_index + (local_3a & 0x3f | 1);
  }
  return (uint)uVar1;
}

Assistant:

LispPTR make_atom(const char *char_base, DLword offset, DLword length)
{
  DLword hash;
  LispPTR hash_entry; /* hash entry contents */
  DLword atom_index;
  DLword reprobe;

  PNCell *pnptr;
  char *pname_base;
  unsigned short first_char;

#ifdef TRACE2
  printf("TRACE: make_atom( %s , offset= %d, len= %d)\n", char_base, offset, length);
#endif

  first_char = (*(char_base + offset)) & 0xff;
  switch (length) {
  case 0:
    /* the zero-length atom has hashcode 0 */
    hash = 0;
    first_char = 255;
    break;

  case 1:
    /* One-character atoms live in well known places, no need to hash */
    if (first_char > '9')
      return ((LispPTR)(ATOMoffset + (first_char - 10)));
    if (first_char >= '0' ) /* 0..9 */
      return ((LispPTR)(S_POSITIVE + (first_char - '0')));
    /* other one character atoms */
    return ((LispPTR)(ATOMoffset + first_char));

  default:
    hash = compute_hash(char_base, offset, length);
    break;
  }

  /* This point corresponds with LP in Lisp source */

  /* following for loop does not exit until it finds new hash entry or same atom */
  for (reprobe = Atom_reprobe(hash, first_char); (hash_entry = GETWORD(AtomHT + hash)) != 0;
       hash = ((hash + reprobe) & 0xffff)) {
    atom_index = (DLword)(hash_entry - 1);
    /* get pname pointer */
    pnptr = (PNCell *)GetPnameCell(atom_index);
    pname_base = (char *)NativeAligned2FromLAddr(POINTERMASK & pnptr->pnamebase);

    if ((length == GETBYTE(pname_base)) &&
        (compare_chars(++pname_base, char_base + offset, length) == T)) {
      DBPRINT(("FOUND the atom. \n"));
      return (atom_index); /* found existing atom */
    }
    DBPRINT(("HASH doesn't hit. reprobe!\n"));

  } /* for end */

  /* we can't find that atom, then we should make new atom */
  DBPRINT(("HASH NEVER HIT.  Returning -1.\n"));
  return (0xffffffff);
  /** Don't create newatom now **/
}